

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O3

bool __thiscall QMainWindow::event(QMainWindow *this,QEvent *event)

{
  ushort uVar1;
  long lVar2;
  QLayoutItem *pQVar3;
  bool bVar4;
  QPoint QVar5;
  QStatusBar *this_00;
  QMainWindowLayout *pQVar6;
  long in_FS_OFFSET;
  double dVar7;
  QPointF QVar8;
  QPoint local_50;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QWidget).field_0x8;
  if ((((*(long *)(lVar2 + 600) != 0) && (*(int *)(*(long *)(lVar2 + 600) + 4) != 0)) &&
      (*(long *)(lVar2 + 0x260) != 0)) &&
     (bVar4 = QMainWindowLayoutSeparatorHelper<QMainWindowLayout>::windowEvent
                        ((QMainWindowLayoutSeparatorHelper<QMainWindowLayout> *)
                         (*(long *)(lVar2 + 0x260) + 0x20),event), bVar4)) goto LAB_0042a4de;
  uVar1 = *(ushort *)(event + 8);
  if (uVar1 < 100) {
    switch(uVar1) {
    case 0x3c:
    case 0x3f:
      if (*(long *)(*(long *)(lVar2 + 0x260) + 0x808) != 0) {
LAB_0042a4da:
        event[0xc] = (QEvent)0x1;
        goto LAB_0042a4de;
      }
      break;
    case 0x3d:
      if (*(long *)(lVar2 + 600) != 0) {
        pQVar3 = *(QLayoutItem **)(*(QMainWindowLayout **)(lVar2 + 0x260) + 0x808);
        if (pQVar3 != (QLayoutItem *)0x0) {
          pQVar6 = *(QMainWindowLayout **)(lVar2 + 0x260);
          if (*(int *)(*(long *)(lVar2 + 600) + 4) == 0) {
            pQVar6 = (QMainWindowLayout *)0x0;
          }
          local_48.d.d = *(Data **)(event + 0x10);
          local_48.d.ptr = *(char16_t **)(event + 0x18);
          QVar8 = QWidget::mapToGlobal(&this->super_QWidget,(QPointF *)&local_48);
          dVar7 = (double)((ulong)QVar8.xp & 0x8000000000000000 | 0x3fe0000000000000) + QVar8.xp;
          bVar4 = 2147483647.0 < dVar7;
          if (dVar7 <= -2147483648.0) {
            dVar7 = -2147483648.0;
          }
          local_50.xp.m_i =
               (int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar7);
          dVar7 = (double)((ulong)QVar8.yp & 0x8000000000000000 | 0x3fe0000000000000) + QVar8.yp;
          bVar4 = 2147483647.0 < dVar7;
          if (dVar7 <= -2147483648.0) {
            dVar7 = -2147483648.0;
          }
          local_50.yp.m_i =
               (int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar7);
          QMainWindowLayout::hover(pQVar6,pQVar3,&local_50);
          goto LAB_0042a4da;
        }
      }
      break;
    case 0x3e:
      if (*(long *)(lVar2 + 600) != 0) {
        pQVar3 = *(QLayoutItem **)(*(QMainWindowLayout **)(lVar2 + 0x260) + 0x808);
        if (pQVar3 != (QLayoutItem *)0x0) {
          pQVar6 = *(QMainWindowLayout **)(lVar2 + 0x260);
          if (*(int *)(*(long *)(lVar2 + 600) + 4) == 0) {
            pQVar6 = (QMainWindowLayout *)0x0;
          }
          QVar5 = QWidget::pos(&this->super_QWidget);
          local_48.d.d = (Data *)(((ulong)(QVar5.xp.m_i.m_i + 1) | (ulong)QVar5 & 0xffffffff00000000
                                  ) + 0x100000000);
          QMainWindowLayout::hover(pQVar6,pQVar3,(QPoint *)&local_48);
          goto LAB_0042a4de;
        }
      }
    }
  }
  else {
    if (uVar1 != 100) {
      if (uVar1 == 0x70) {
        this_00 = QMainWindowLayout::statusBar(*(QMainWindowLayout **)(lVar2 + 0x260));
        if (this_00 == (QStatusBar *)0x0) {
          event[0xc] = (QEvent)0x0;
        }
        else {
          local_48.d.d = *(Data **)(event + 0x10);
          local_48.d.ptr = *(char16_t **)(event + 0x18);
          local_48.d.size = *(qsizetype *)(event + 0x20);
          if ((QSize)local_48.d.d != (QSize)0x0) {
            LOCK();
            *(int *)local_48.d.d = *(int *)local_48.d.d + 1;
            UNLOCK();
          }
          QStatusBar::showMessage(this_00,&local_48,0);
          if ((QSize)local_48.d.d != (QSize)0x0) {
            LOCK();
            *(int *)local_48.d.d = *(int *)local_48.d.d + -1;
            UNLOCK();
            if (*(int *)local_48.d.d == 0) {
              QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
      }
      else {
        if (uVar1 != 0x78) goto switchD_0042a358_default;
        QMainWindowLayout::toggleToolBarsVisible(*(QMainWindowLayout **)(lVar2 + 0x260));
      }
LAB_0042a4de:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return true;
      }
      goto LAB_0042a622;
    }
    QDockAreaLayout::styleChangedEvent((QDockAreaLayout *)(*(long *)(lVar2 + 0x260) + 0x1a0));
    if (*(char *)(lVar2 + 0x270) == '\0') {
      local_48.d.d = (Data *)0xffffffffffffffff;
      setIconSize(this,(QSize *)&local_48);
    }
  }
switchD_0042a358_default:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    bVar4 = QWidget::event(&this->super_QWidget,event);
    return bVar4;
  }
LAB_0042a622:
  __stack_chk_fail();
}

Assistant:

bool QMainWindow::event(QEvent *event)
{
    Q_D(QMainWindow);

#if QT_CONFIG(dockwidget)
    if (d->layout && d->layout->windowEvent(event))
        return true;
#endif

    switch (event->type()) {

#if QT_CONFIG(toolbar)
        case QEvent::ToolBarChange: {
            Q_ASSERT(d->layout);
            d->layout->toggleToolBarsVisible();
            return true;
        }
#endif

#if QT_CONFIG(statustip)
        case QEvent::StatusTip:
#if QT_CONFIG(statusbar)
            Q_ASSERT(d->layout);
            if (QStatusBar *sb = d->layout->statusBar())
                sb->showMessage(static_cast<QStatusTipEvent*>(event)->tip());
            else
#endif
                static_cast<QStatusTipEvent*>(event)->ignore();
            return true;
#endif // QT_CONFIG(statustip)

        case QEvent::StyleChange:
#if QT_CONFIG(dockwidget)
            Q_ASSERT(d->layout);
            d->layout->layoutState.dockAreaLayout.styleChangedEvent();
#endif
            if (!d->explicitIconSize)
                setIconSize(QSize());
            break;
#if QT_CONFIG(draganddrop)
        case QEvent::DragEnter:
        case QEvent::Drop:
            if (!d->layout->draggingWidget)
                break;
            event->accept();
            return true;
        case QEvent::DragMove: {
            if (!d->layout->draggingWidget)
                break;
            auto dragMoveEvent = static_cast<QDragMoveEvent *>(event);
            d->layout->hover(d->layout->draggingWidget,
                             mapToGlobal(dragMoveEvent->position()).toPoint());
            event->accept();
            return true;
        }
        case QEvent::DragLeave:
            if (!d->layout->draggingWidget)
                break;
            d->layout->hover(d->layout->draggingWidget, pos() - QPoint(-1, -1));
            return true;
#endif
        default:
            break;
    }

    return QWidget::event(event);
}